

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O1

wchar_t tree_enter_initial_dir(tree *t)

{
  wchar_t in_EAX;
  
  if (((t->flags & 0x100) == 0) && (in_EAX = fchdir(t->initial_dir_fd), in_EAX == L'\0')) {
    in_EAX = t->flags & 0xfffffebfU | 0x100;
    t->flags = in_EAX;
  }
  return in_EAX;
}

Assistant:

static int
tree_enter_initial_dir(struct tree *t)
{
	int r = 0;

	if ((t->flags & onInitialDir) == 0) {
		r = fchdir(t->initial_dir_fd);
		if (r == 0) {
			t->flags &= ~onWorkingDir;
			t->flags |= onInitialDir;
		}
	}
	return (r);
}